

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_external_partition_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_e0998c::ExternalPartitionTestDfsAPI_EncodeMatch_Test::TestBody
          (ExternalPartitionTestDfsAPI_EncodeMatch_Test *this)

{
  uint uVar1;
  bool bVar2;
  SEARCH_METHODS *message;
  double rhs_value;
  AssertHelper local_120;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  AssertHelper local_f8;
  double local_f0;
  Y4mVideoSource video;
  
  std::__cxx11::string::string
            ((string *)&gtest_fatal_failure_checker,"paris_352_288_30.y4m",(allocator *)&local_120);
  libaom_test::Y4mVideoSource::Y4mVideoSource(&video,(string *)&gtest_fatal_failure_checker,0,8);
  std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
  (this->super_ExternalPartitionTestDfsAPI).use_external_partition_ = false;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      (*(this->super_ExternalPartitionTestDfsAPI).super_EncoderTest._vptr_EncoderTest[2])
                (&(this->super_ExternalPartitionTestDfsAPI).super_EncoderTest,&video);
    }
    bVar2 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar2 != false) goto LAB_005741f8;
    uVar1 = (this->super_ExternalPartitionTestDfsAPI).nframes_;
    local_f0 = 0.0;
    if (uVar1 != 0) {
      local_f0 = (this->super_ExternalPartitionTestDfsAPI).psnr_ / (double)uVar1;
    }
    (this->super_ExternalPartitionTestDfsAPI).use_external_partition_ = true;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                (&gtest_fatal_failure_checker);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        (*(this->super_ExternalPartitionTestDfsAPI).super_EncoderTest._vptr_EncoderTest[2])
                  (&(this->super_ExternalPartitionTestDfsAPI).super_EncoderTest,&video);
      }
      bVar2 = gtest_fatal_failure_checker.has_new_fatal_failure_;
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                (&gtest_fatal_failure_checker);
      if (bVar2 == false) {
        uVar1 = (this->super_ExternalPartitionTestDfsAPI).nframes_;
        rhs_value = 0.0;
        if (uVar1 != 0) {
          rhs_value = (this->super_ExternalPartitionTestDfsAPI).psnr_ / (double)uVar1;
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)&gtest_fatal_failure_checker,"psnr","psnr2",local_f0,rhs_value);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_120);
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            message = "";
          }
          else {
            message = *(SEARCH_METHODS **)
                       CONCAT71(gtest_fatal_failure_checker._9_7_,
                                gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_external_partition_test.cc"
                     ,0x28e,(char *)message);
          testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_f8);
          if (local_120.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_120.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
        goto LAB_0057424b;
      }
    }
    testing::Message::Message((Message *)&gtest_fatal_failure_checker);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_external_partition_test.cc"
               ,0x28b,
               "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_fatal_failure_checker);
  }
  else {
LAB_005741f8:
    testing::Message::Message((Message *)&gtest_fatal_failure_checker);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_external_partition_test.cc"
               ,0x287,
               "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_fatal_failure_checker);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_0057424b:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(&video);
  return;
}

Assistant:

TEST_P(ExternalPartitionTestDfsAPI, EncodeMatch) {
  ::libaom_test::Y4mVideoSource video("paris_352_288_30.y4m", 0, kFrameNum);
  SetExternalPartition(false);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr = GetAveragePsnr();

  SetExternalPartition(true);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr2 = GetAveragePsnr();

  EXPECT_DOUBLE_EQ(psnr, psnr2);
}